

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O3

list_elem * list_pop_front(list *list)

{
  list_elem *plVar1;
  list_elem *plVar2;
  list_elem *plVar3;
  
  plVar1 = list->head;
  if (plVar1 != (list_elem *)0x0) {
    plVar2 = plVar1->prev;
    plVar3 = plVar1->next;
    if (plVar3 != (list_elem *)0x0) {
      plVar3->prev = plVar2;
    }
    if (plVar2 != (list_elem *)0x0) {
      plVar2->next = plVar3;
      plVar3 = plVar1->next;
    }
    list->head = plVar3;
    if (list->tail == plVar1) {
      list->tail = plVar2;
      return plVar1;
    }
  }
  return plVar1;
}

Assistant:

struct list_elem *list_pop_front(struct list *list)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    struct list_elem *e = list->head;
    if (e) {
        // if not NULL
        if (e->next) e->next->prev = e->prev;
        if (e->prev) e->prev->next = e->next;

        if (list->head == e) list->head = e->next;
        if (list->tail == e) list->tail = e->prev;

        IFDEF_LOCK( spin_unlock(&list->lock); );
        return e;
    }
    // NULL .. do nothing
    IFDEF_LOCK( spin_unlock(&list->lock); );
    return NULL;
}